

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegEa<(moira::Instr)83,(moira::Mode)2,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  ulong uVar4;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)4,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar4 = -(ulong)local_20;
    bVar1 = (bool)((byte)(uVar4 >> 0x20) & 1);
    (this->reg).sr.c = bVar1;
    (this->reg).sr.x = bVar1;
    uVar3 = (uint)uVar4;
    (this->reg).sr.v = (int)(uVar3 & local_20) < 0;
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0x1f) & 1);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    local_20 = uVar3;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    uVar3 = local_20;
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,local_1c,local_20 >> 0x10);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_1c + 2,uVar3 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}